

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  float *pfVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ImFont **ppIVar5;
  ImFont *font;
  ImGuiWindow *pIVar6;
  ImGuiWindow **ppIVar7;
  float fVar8;
  bool local_69;
  float local_68;
  float local_64;
  float local_60;
  ImVec2 local_50;
  ImGuiWindow *local_48;
  ImGuiWindow *window_1;
  ImGuiWindow *pIStack_38;
  int i_1;
  ImGuiWindow *window;
  int local_28;
  float fStack_24;
  int i;
  float local_1c;
  float fStack_18;
  int local_14;
  ImGuiContext *pIStack_10;
  int n;
  ImGuiContext *g;
  
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd61,"void ImGui::NewFrame()");
  }
  pIStack_10 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  if ((0.0 < (GImGui->IO).DeltaTime) || (bVar2 = false, GImGui->FrameCount == 0)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6b,"void ImGui::NewFrame()");
  }
  if ((GImGui->FrameCount == 0) || (bVar2 = false, GImGui->FrameCountEnded == GImGui->FrameCount)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  bVar2 = false;
  if ((0.0 <= (GImGui->IO).DisplaySize.x) && (bVar2 = false, 0.0 <= (GImGui->IO).DisplaySize.y)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  if ((((GImGui->IO).Fonts)->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  ppIVar5 = ImVector<ImFont_*>::operator[](&((GImGui->IO).Fonts)->Fonts,0);
  bVar2 = ImFont::IsLoaded(*ppIVar5);
  if (!bVar2) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  if ((pIStack_10->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd70,"void ImGui::NewFrame()");
  }
  bVar2 = false;
  if ((0.0 <= (pIStack_10->Style).Alpha) && (bVar2 = false, (pIStack_10->Style).Alpha <= 1.0)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd71,"void ImGui::NewFrame()");
  }
  bVar2 = false;
  if ((1.0 <= (pIStack_10->Style).WindowMinSize.x) &&
     (bVar2 = false, 1.0 <= (pIStack_10->Style).WindowMinSize.y)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd72,"void ImGui::NewFrame()");
  }
  for (local_14 = 0; local_14 < 0x15; local_14 = local_14 + 1) {
    bVar2 = false;
    if ((-2 < (pIStack_10->IO).KeyMap[local_14]) &&
       (bVar2 = false, (pIStack_10->IO).KeyMap[local_14] < 0x200)) {
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd74,"void ImGui::NewFrame()");
    }
  }
  if ((((pIStack_10->IO).ConfigFlags & 1U) != 0) && ((pIStack_10->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd78,"void ImGui::NewFrame()");
  }
  if ((((pIStack_10->IO).ConfigWindowsResizeFromEdges & 1U) != 0) &&
     (((pIStack_10->IO).BackendFlags & 2U) == 0)) {
    (pIStack_10->IO).ConfigWindowsResizeFromEdges = false;
  }
  if ((pIStack_10->SettingsLoaded & 1U) == 0) {
    bVar2 = ImVector<ImGuiWindowSettings>::empty(&pIStack_10->SettingsWindows);
    if (!bVar2) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd81,"void ImGui::NewFrame()");
    }
    if ((pIStack_10->IO).IniFilename != (char *)0x0) {
      LoadIniSettingsFromDisk((pIStack_10->IO).IniFilename);
    }
    pIStack_10->SettingsLoaded = true;
  }
  if ((0.0 < pIStack_10->SettingsDirtyTimer) &&
     (pIStack_10->SettingsDirtyTimer = pIStack_10->SettingsDirtyTimer - (pIStack_10->IO).DeltaTime,
     pIStack_10->SettingsDirtyTimer <= 0.0)) {
    if ((pIStack_10->IO).IniFilename == (char *)0x0) {
      (pIStack_10->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk((pIStack_10->IO).IniFilename);
    }
    pIStack_10->SettingsDirtyTimer = 0.0;
  }
  pIStack_10->Time = (double)(pIStack_10->IO).DeltaTime + pIStack_10->Time;
  pIStack_10->FrameScopeActive = true;
  pIStack_10->FrameCount = pIStack_10->FrameCount + 1;
  pIStack_10->TooltipOverrideCount = 0;
  pIStack_10->WindowsActiveCount = 0;
  ((pIStack_10->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  bVar2 = ImFont::IsLoaded(pIStack_10->Font);
  if (bVar2) {
    ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffdc,0.0,0.0,(pIStack_10->IO).DisplaySize.x,
                   (pIStack_10->IO).DisplaySize.y);
    (pIStack_10->DrawListSharedData).ClipRectFullscreen.x = fStack_24;
    (pIStack_10->DrawListSharedData).ClipRectFullscreen.y = (float)i;
    (pIStack_10->DrawListSharedData).ClipRectFullscreen.z = local_1c;
    (pIStack_10->DrawListSharedData).ClipRectFullscreen.w = fStack_18;
    (pIStack_10->DrawListSharedData).CurveTessellationTol = (pIStack_10->Style).CurveTessellationTol
    ;
    ImDrawList::Clear(&pIStack_10->BackgroundDrawList);
    ImDrawList::PushTextureID(&pIStack_10->BackgroundDrawList,((pIStack_10->IO).Fonts)->TexID);
    ImDrawList::PushClipRectFullScreen(&pIStack_10->BackgroundDrawList);
    uVar3 = 0;
    if (((pIStack_10->Style).AntiAliasedFill & 1U) != 0) {
      uVar3 = 2;
    }
    (pIStack_10->BackgroundDrawList).Flags =
         ((pIStack_10->Style).AntiAliasedLines & 1U) != 0 | uVar3;
    ImDrawList::Clear(&pIStack_10->ForegroundDrawList);
    ImDrawList::PushTextureID(&pIStack_10->ForegroundDrawList,((pIStack_10->IO).Fonts)->TexID);
    ImDrawList::PushClipRectFullScreen(&pIStack_10->ForegroundDrawList);
    uVar3 = 0;
    if (((pIStack_10->Style).AntiAliasedFill & 1U) != 0) {
      uVar3 = 2;
    }
    (pIStack_10->ForegroundDrawList).Flags =
         ((pIStack_10->Style).AntiAliasedLines & 1U) != 0 | uVar3;
    ImDrawData::Clear(&pIStack_10->DrawData);
    if (((pIStack_10->DragDropActive & 1U) != 0) &&
       ((pIStack_10->DragDropPayload).SourceId == pIStack_10->ActiveId)) {
      KeepAliveID((pIStack_10->DragDropPayload).SourceId);
    }
    if (pIStack_10->HoveredIdPreviousFrame == 0) {
      pIStack_10->HoveredIdTimer = 0.0;
    }
    if ((pIStack_10->HoveredIdPreviousFrame == 0) ||
       ((pIStack_10->HoveredId != 0 && (pIStack_10->ActiveId == pIStack_10->HoveredId)))) {
      pIStack_10->HoveredIdNotActiveTimer = 0.0;
    }
    if (pIStack_10->HoveredId != 0) {
      pIStack_10->HoveredIdTimer = (pIStack_10->IO).DeltaTime + pIStack_10->HoveredIdTimer;
    }
    if ((pIStack_10->HoveredId != 0) && (pIStack_10->ActiveId != pIStack_10->HoveredId)) {
      pIStack_10->HoveredIdNotActiveTimer =
           (pIStack_10->IO).DeltaTime + pIStack_10->HoveredIdNotActiveTimer;
    }
    pIStack_10->HoveredIdPreviousFrame = pIStack_10->HoveredId;
    pIStack_10->HoveredId = 0;
    pIStack_10->HoveredIdAllowOverlap = false;
    if (((pIStack_10->ActiveIdIsAlive != pIStack_10->ActiveId) &&
        (pIStack_10->ActiveIdPreviousFrame == pIStack_10->ActiveId)) && (pIStack_10->ActiveId != 0))
    {
      ClearActiveID();
    }
    if (pIStack_10->ActiveId != 0) {
      pIStack_10->ActiveIdTimer = (pIStack_10->IO).DeltaTime + pIStack_10->ActiveIdTimer;
    }
    pIStack_10->LastActiveIdTimer = (pIStack_10->IO).DeltaTime + pIStack_10->LastActiveIdTimer;
    pIStack_10->ActiveIdPreviousFrame = pIStack_10->ActiveId;
    pIStack_10->ActiveIdPreviousFrameWindow = pIStack_10->ActiveIdWindow;
    pIStack_10->ActiveIdPreviousFrameHasBeenEdited = (bool)(pIStack_10->ActiveIdHasBeenEdited & 1);
    pIStack_10->ActiveIdIsAlive = 0;
    pIStack_10->ActiveIdPreviousFrameIsAlive = false;
    pIStack_10->ActiveIdIsJustActivated = false;
    if ((pIStack_10->TempInputTextId != 0) && (pIStack_10->ActiveId != pIStack_10->TempInputTextId))
    {
      pIStack_10->TempInputTextId = 0;
    }
    pIStack_10->DragDropAcceptIdPrev = pIStack_10->DragDropAcceptIdCurr;
    pIStack_10->DragDropAcceptIdCurr = 0;
    pIStack_10->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
    pIStack_10->DragDropWithinSourceOrTarget = false;
    memcpy((pIStack_10->IO).KeysDownDurationPrev,(pIStack_10->IO).KeysDownDuration,0x800);
    for (local_28 = 0; local_28 < 0x200; local_28 = local_28 + 1) {
      if (((pIStack_10->IO).KeysDown[local_28] & 1U) == 0) {
        local_64 = -1.0;
      }
      else {
        pfVar1 = (pIStack_10->IO).KeysDownDuration + local_28;
        if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
          local_60 = (pIStack_10->IO).KeysDownDuration[local_28] + (pIStack_10->IO).DeltaTime;
        }
        else {
          local_60 = 0.0;
        }
        local_64 = local_60;
      }
      (pIStack_10->IO).KeysDownDuration[local_28] = local_64;
    }
    NavUpdate();
    UpdateMouseInputs();
    pIStack_10->FramerateSecPerFrameAccum =
         ((pIStack_10->IO).DeltaTime -
         pIStack_10->FramerateSecPerFrame[pIStack_10->FramerateSecPerFrameIdx]) +
         pIStack_10->FramerateSecPerFrameAccum;
    pIStack_10->FramerateSecPerFrame[pIStack_10->FramerateSecPerFrameIdx] =
         (pIStack_10->IO).DeltaTime;
    pIStack_10->FramerateSecPerFrameIdx = (pIStack_10->FramerateSecPerFrameIdx + 1) % 0x78;
    if (pIStack_10->FramerateSecPerFrameAccum <= 0.0) {
      local_68 = 3.4028235e+38;
    }
    else {
      local_68 = 1.0 / (pIStack_10->FramerateSecPerFrameAccum / 120.0);
    }
    (pIStack_10->IO).Framerate = local_68;
    UpdateMouseMovingWindowNewFrame();
    UpdateHoveredWindowAndCaptureFlags();
    pIVar6 = GetFrontMostPopupModal();
    if ((pIVar6 != (ImGuiWindow *)0x0) ||
       ((pIStack_10->NavWindowingTarget != (ImGuiWindow *)0x0 &&
        (0.0 < pIStack_10->NavWindowingHighlightAlpha)))) {
      fVar8 = ImMin<float>((pIStack_10->IO).DeltaTime * 6.0 + pIStack_10->DimBgRatio,1.0);
      pIStack_10->DimBgRatio = fVar8;
    }
    else {
      fVar8 = ImMax<float>(-(pIStack_10->IO).DeltaTime * 10.0 + pIStack_10->DimBgRatio,0.0);
      pIStack_10->DimBgRatio = fVar8;
    }
    pIStack_10->MouseCursor = 0;
    pIStack_10->WantTextInputNextFrame = -1;
    pIStack_10->WantCaptureKeyboardNextFrame = -1;
    pIStack_10->WantCaptureMouseNextFrame = -1;
    ImVec2::ImVec2((ImVec2 *)&window,1.0,1.0);
    pIStack_10->PlatformImePos = (ImVec2)window;
    UpdateMouseWheel();
    local_69 = false;
    if ((((pIStack_10->NavWindow != (ImGuiWindow *)0x0) &&
         (local_69 = false, (pIStack_10->NavWindow->Active & 1U) != 0)) &&
        (local_69 = false, (pIStack_10->NavWindow->Flags & 0x40000U) == 0)) &&
       (local_69 = false, ((pIStack_10->IO).KeyCtrl & 1U) == 0)) {
      local_69 = IsKeyPressedMap(0,true);
    }
    pIStack_10->FocusTabPressed = local_69;
    if ((pIStack_10->ActiveId == 0) && ((pIStack_10->FocusTabPressed & 1U) != 0)) {
      pIStack_10->FocusRequestNextWindow = pIStack_10->NavWindow;
      pIStack_10->FocusRequestNextCounterAll = 0x7fffffff;
      if ((pIStack_10->NavId == 0) || (pIStack_10->NavIdTabCounter == 0x7fffffff)) {
        iVar4 = 0;
        if (((pIStack_10->IO).KeyShift & 1U) != 0) {
          iVar4 = -1;
        }
        pIStack_10->FocusRequestNextCounterTab = iVar4;
      }
      else {
        iVar4 = 1;
        if (((pIStack_10->IO).KeyShift & 1U) != 0) {
          iVar4 = -1;
        }
        pIStack_10->FocusRequestNextCounterTab = pIStack_10->NavIdTabCounter + 1 + iVar4;
      }
    }
    pIStack_10->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
    pIStack_10->FocusRequestCurrCounterTab = 0x7fffffff;
    pIStack_10->FocusRequestCurrCounterAll = 0x7fffffff;
    if (pIStack_10->FocusRequestNextWindow != (ImGuiWindow *)0x0) {
      pIStack_38 = pIStack_10->FocusRequestNextWindow;
      pIStack_10->FocusRequestCurrWindow = pIStack_38;
      if ((pIStack_10->FocusRequestNextCounterAll != 0x7fffffff) &&
         ((pIStack_38->DC).FocusCounterAll != -1)) {
        iVar4 = ImModPositive(pIStack_10->FocusRequestNextCounterAll,
                              (pIStack_38->DC).FocusCounterAll + 1);
        pIStack_10->FocusRequestCurrCounterAll = iVar4;
      }
      if ((pIStack_10->FocusRequestNextCounterTab != 0x7fffffff) &&
         ((pIStack_38->DC).FocusCounterTab != -1)) {
        iVar4 = ImModPositive(pIStack_10->FocusRequestNextCounterTab,
                              (pIStack_38->DC).FocusCounterTab + 1);
        pIStack_10->FocusRequestCurrCounterTab = iVar4;
      }
      pIStack_10->FocusRequestNextWindow = (ImGuiWindow *)0x0;
      pIStack_10->FocusRequestNextCounterTab = 0x7fffffff;
      pIStack_10->FocusRequestNextCounterAll = 0x7fffffff;
    }
    pIStack_10->NavIdTabCounter = 0x7fffffff;
    if ((pIStack_10->WindowsFocusOrder).Size != (pIStack_10->Windows).Size) {
      __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xe15,"void ImGui::NewFrame()");
    }
    for (window_1._4_4_ = 0; window_1._4_4_ != (pIStack_10->Windows).Size;
        window_1._4_4_ = window_1._4_4_ + 1) {
      ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&pIStack_10->Windows,window_1._4_4_);
      local_48 = *ppIVar7;
      local_48->WasActive = (bool)(local_48->Active & 1);
      local_48->BeginCount = 0;
      local_48->Active = false;
      local_48->WriteAccessed = false;
    }
    if ((pIStack_10->NavWindow != (ImGuiWindow *)0x0) &&
       ((pIStack_10->NavWindow->WasActive & 1U) == 0)) {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindow_*>::resize(&pIStack_10->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&pIStack_10->BeginPopupStack,0);
    ClosePopupsOverWindow(pIStack_10->NavWindow,false);
    ImVec2::ImVec2(&local_50,400.0,400.0);
    SetNextWindowSize(&local_50,4);
    Begin("Debug##Default",(bool *)0x0,0);
    pIStack_10->FrameScopePushedImplicitWindow = true;
    return;
  }
  __assert_fail("g.Font->IsLoaded()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                ,0xd9e,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT((g.IO.DeltaTime > 0.0f || g.FrameCount == 0)              && "Need a positive DeltaTime!");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value!");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting!");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!");
    IM_ASSERT(g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && "Invalid style setting.");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check: required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Perform simple check: the beta io.ConfigWindowsResizeFromEdges option requires back-end to honor mouse cursor changes and set the ImGuiBackendFlags_HasMouseCursors flag accordingly.
    if (g.IO.ConfigWindowsResizeFromEdges && !(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseCursors))
        g.IO.ConfigWindowsResizeFromEdges = false;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();
    g.BackgroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();
    g.ForegroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEdited = g.ActiveIdHasBeenEdited;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();
    UpdateHoveredWindowAndCaptureFlags();

    // Background darkening/whitening
    if (GetFrontMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}